

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O3

bool divsufsortxx::helper::
     partition<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
               (substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td,iterator first1,
               iterator first2,iterator last,iterator *mfirst,iterator *mlast,value_type *v)

{
  char cVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  long lVar4;
  char cVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  pos_type pVar9;
  BitmapArray<long> *pBVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  iterator first1_00;
  iterator first1_01;
  iterator last1;
  iterator first2_00;
  ulong local_78;
  ulong local_58;
  
  uVar11 = last.pos_;
  pBVar10 = last.array_;
  uVar12 = first2.pos_;
  last1.array_ = first2.array_;
  pVar9 = first1.pos_;
  if (uVar12 < uVar11) {
    do {
      iVar2 = (*((last1.array_)->super_Bitmap)._vptr_Bitmap[5])(last1.array_,uVar12);
      iVar2 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                        (Td.m_PA.array_,CONCAT44(extraout_var,iVar2) + Td.m_PA.pos_);
      cVar1 = Td.m_Td[CONCAT44(extraout_var_00,iVar2)];
      cVar5 = *v;
      if (cVar1 != cVar5) goto LAB_00108c34;
      uVar12 = uVar12 + 1;
      uVar8 = uVar11;
      local_58 = uVar11;
      uVar7 = uVar11;
    } while (uVar11 != uVar12);
  }
  else {
    cVar5 = *v;
    cVar1 = '\0';
LAB_00108c34:
    uVar8 = uVar11;
    local_58 = uVar12;
    uVar7 = uVar12;
    if (((uVar12 < uVar11) && (cVar1 < cVar5)) &&
       (uVar6 = uVar12 + 1, uVar7 = uVar6, uVar6 < uVar11)) {
      do {
        iVar2 = (*((last1.array_)->super_Bitmap)._vptr_Bitmap[5])(last1.array_,uVar6);
        iVar2 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                          (Td.m_PA.array_,CONCAT44(extraout_var_01,iVar2) + Td.m_PA.pos_);
        local_58 = uVar12;
        uVar7 = uVar6;
        if (*v < Td.m_Td[CONCAT44(extraout_var_02,iVar2)]) break;
        if (Td.m_Td[CONCAT44(extraout_var_02,iVar2)] == *v) {
          local_58 = uVar12 + 1;
          iVar2 = (*((last1.array_)->super_Bitmap)._vptr_Bitmap[5])(last1.array_,uVar6);
          iVar3 = (*((last1.array_)->super_Bitmap)._vptr_Bitmap[5])(last1.array_,uVar12);
          (*((last1.array_)->super_Bitmap)._vptr_Bitmap[4])
                    (last1.array_,uVar6,CONCAT44(extraout_var_04,iVar3));
          (*((last1.array_)->super_Bitmap)._vptr_Bitmap[4])
                    (last1.array_,uVar12,CONCAT44(extraout_var_03,iVar2));
        }
        uVar6 = uVar6 + 1;
        uVar12 = local_58;
        uVar7 = uVar11;
      } while (uVar11 != uVar6);
    }
  }
  do {
    uVar12 = uVar8;
    uVar8 = uVar12 - 1;
    if (uVar8 <= uVar7) {
      local_78 = uVar12 - 1;
      uVar6 = local_78;
      goto LAB_00108e56;
    }
    iVar2 = (*(pBVar10->super_Bitmap)._vptr_Bitmap[5])(pBVar10,uVar8);
    iVar2 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                      (Td.m_PA.array_,CONCAT44(extraout_var_05,iVar2) + Td.m_PA.pos_);
  } while (Td.m_Td[CONCAT44(extraout_var_06,iVar2)] == *v);
  local_78 = uVar12 - 1;
  uVar6 = local_78;
  if (*v < Td.m_Td[CONCAT44(extraout_var_06,iVar2)]) {
    uVar12 = uVar12 - 2;
    local_78 = uVar8;
    uVar6 = uVar12;
    for (; uVar7 < uVar12; uVar12 = uVar12 - 1) {
      iVar2 = (*(pBVar10->super_Bitmap)._vptr_Bitmap[5])(pBVar10,uVar12);
      iVar2 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                        (Td.m_PA.array_,CONCAT44(extraout_var_07,iVar2) + Td.m_PA.pos_);
      uVar6 = uVar12;
      if (Td.m_Td[CONCAT44(extraout_var_08,iVar2)] < *v) break;
      uVar8 = local_78;
      if (Td.m_Td[CONCAT44(extraout_var_08,iVar2)] == *v) {
        uVar8 = local_78 - 1;
        iVar2 = (*(pBVar10->super_Bitmap)._vptr_Bitmap[5])(pBVar10,uVar12);
        iVar3 = (*(pBVar10->super_Bitmap)._vptr_Bitmap[5])(pBVar10,local_78);
        (*(pBVar10->super_Bitmap)._vptr_Bitmap[4])(pBVar10,uVar12,CONCAT44(extraout_var_10,iVar3));
        (*(pBVar10->super_Bitmap)._vptr_Bitmap[4])(pBVar10,local_78,CONCAT44(extraout_var_09,iVar2))
        ;
      }
      local_78 = uVar8;
      uVar6 = uVar7;
    }
  }
LAB_00108e56:
  do {
    do {
      if (uVar6 <= uVar7) {
        if (local_58 <= local_78) {
          lVar14 = uVar7 - local_58;
          lVar4 = local_58 - pVar9;
          if (lVar14 < (long)(local_58 - pVar9)) {
            lVar4 = lVar14;
          }
          first1_00.pos_ = uVar7 - lVar4;
          first1_00.array_ = last1.array_;
          last1.pos_ = uVar7;
          vecswap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                    (first1_00,last1,first1);
          lVar13 = (local_78 - uVar7) + 1;
          lVar4 = ~local_78 + uVar11;
          if (lVar13 <= (long)(~local_78 + uVar11)) {
            lVar4 = lVar13;
          }
          first1_01.pos_ = uVar11 - lVar4;
          first1_01.array_ = pBVar10;
          first2_00.pos_ = uVar7;
          first2_00.array_ = last1.array_;
          vecswap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                    (first1_01,last,first2_00);
          pVar9 = pVar9 + lVar14;
          uVar11 = uVar11 - lVar13;
        }
        mfirst->array_ = first1.array_;
        mfirst->pos_ = pVar9;
        mlast->array_ = pBVar10;
        mlast->pos_ = uVar11;
        return local_58 <= local_78;
      }
      iVar2 = (*((last1.array_)->super_Bitmap)._vptr_Bitmap[5])(last1.array_,uVar7);
      iVar3 = (*(pBVar10->super_Bitmap)._vptr_Bitmap[5])(pBVar10,uVar6);
      (*((last1.array_)->super_Bitmap)._vptr_Bitmap[4])
                (last1.array_,uVar7,CONCAT44(extraout_var_12,iVar3));
      (*(pBVar10->super_Bitmap)._vptr_Bitmap[4])(pBVar10,uVar6,CONCAT44(extraout_var_11,iVar2));
      uVar12 = uVar7 + 1;
      uVar7 = uVar12;
      if (uVar12 < uVar6) {
        do {
          iVar2 = (*((last1.array_)->super_Bitmap)._vptr_Bitmap[5])(last1.array_,uVar12);
          iVar2 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                            (Td.m_PA.array_,CONCAT44(extraout_var_13,iVar2) + Td.m_PA.pos_);
          uVar7 = uVar12;
          if (*v < Td.m_Td[CONCAT44(extraout_var_14,iVar2)]) break;
          if (Td.m_Td[CONCAT44(extraout_var_14,iVar2)] == *v) {
            iVar2 = (*((last1.array_)->super_Bitmap)._vptr_Bitmap[5])(last1.array_,uVar12);
            iVar3 = (*((last1.array_)->super_Bitmap)._vptr_Bitmap[5])(last1.array_,local_58);
            (*((last1.array_)->super_Bitmap)._vptr_Bitmap[4])
                      (last1.array_,uVar12,CONCAT44(extraout_var_16,iVar3));
            (*((last1.array_)->super_Bitmap)._vptr_Bitmap[4])
                      (last1.array_,local_58,CONCAT44(extraout_var_15,iVar2));
            local_58 = local_58 + 1;
          }
          uVar12 = uVar12 + 1;
          uVar7 = uVar6;
        } while (uVar6 != uVar12);
      }
      uVar12 = uVar6 - 1;
      uVar6 = uVar12;
    } while (uVar12 <= uVar7);
    do {
      iVar2 = (*(pBVar10->super_Bitmap)._vptr_Bitmap[5])(pBVar10,uVar12);
      iVar2 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                        (Td.m_PA.array_,CONCAT44(extraout_var_17,iVar2) + Td.m_PA.pos_);
      uVar6 = uVar12;
      if (Td.m_Td[CONCAT44(extraout_var_18,iVar2)] < *v) break;
      if (Td.m_Td[CONCAT44(extraout_var_18,iVar2)] == *v) {
        iVar2 = (*(pBVar10->super_Bitmap)._vptr_Bitmap[5])(pBVar10,uVar12);
        iVar3 = (*(pBVar10->super_Bitmap)._vptr_Bitmap[5])(pBVar10,local_78);
        (*(pBVar10->super_Bitmap)._vptr_Bitmap[4])(pBVar10,uVar12,CONCAT44(extraout_var_20,iVar3));
        (*(pBVar10->super_Bitmap)._vptr_Bitmap[4])(pBVar10,local_78,CONCAT44(extraout_var_19,iVar2))
        ;
        local_78 = local_78 - 1;
      }
      uVar12 = uVar12 - 1;
      uVar6 = uVar7;
    } while (uVar7 < uVar12);
  } while( true );
}

Assistant:

bool partition(
    const StringIterator_type Td, SAIterator_type first1,
    SAIterator_type first2, SAIterator_type last, SAIterator_type &mfirst,
    SAIterator_type &mlast,
    const typename std::iterator_traits<StringIterator_type>::value_type &v) {
  SAIterator_type a, b, c, d;
  typename std::iterator_traits<StringIterator_type>::value_type x = 0;

  for (b = first2; (b < last) && ((x = Td[*b]) == v); ++b) {
  }
  if (((a = b) < last) && (x < v)) {
    for (; (++b < last) && ((x = Td[*b]) <= v);) {
      if (x == v) {
        std::iter_swap(b, a++);
      }
    }
  }
  for (c = last; (b < --c) && ((x = Td[*c]) == v);) {
  }
  if ((b < (d = c)) && (x > v)) {
    for (; (b < --c) && ((x = Td[*c]) >= v);) {
      if (x == v) {
        std::iter_swap(c, d--);
      }
    }
  }
  for (; b < c;) {
    std::iter_swap(b, c);
    for (; (++b < c) && ((x = Td[*b]) <= v);) {
      if (x == v) {
        std::iter_swap(b, a++);
      }
    }
    for (; (b < --c) && ((x = Td[*c]) >= v);) {
      if (x == v) {
        std::iter_swap(c, d--);
      }
    }
  }

  if (a <= d) {
    vecswap(b - std::min(a - first1, b - a), b, first1);
    vecswap(last - std::min(d + 1 - b, last - d - 1), last, b);
    mfirst = first1 + (b - a), mlast = last - (d + 1 - b);
    return true;
  }
  mfirst = first1, mlast = last;
  return false;
}